

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::StatementBlockSymbol::elaborateVariables
          (StatementBlockSymbol *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  SyntaxKind SVar1;
  RsRuleSyntax *syntax;
  Symbol *pSVar2;
  undefined8 uVar3;
  bool bVar4;
  Expression *pEVar5;
  intptr_t iVar6;
  long lVar7;
  long lVar8;
  _func_void_intptr_t_Symbol_ptr *p_Var9;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  undefined1 local_e0 [120];
  ASTContext local_68;
  
  iVar6 = insertCB.callable;
  p_Var9 = insertCB.callback;
  syntax = (RsRuleSyntax *)(this->super_Symbol).originatingSyntax;
  if (syntax != (RsRuleSyntax *)0x0) {
    SVar1 = (syntax->super_SyntaxNode).kind;
    if ((int)SVar1 < 0x16d) {
      if (SVar1 == ConditionalPattern) {
        local_68.scope.ptr = &this->super_Scope;
        local_68.lookupIndex = 0xffffffff;
        local_68.flags.m_bits = 0;
        local_68.instanceOrProc = (Symbol *)0x0;
        local_68.firstTempVar = (TempVarSymbol *)0x0;
        local_68.randomizeDetails = (RandomizeDetails *)0x0;
        local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
        local_e0._0_8_ = local_e0 + 0x18;
        local_e0._8_8_ = 0;
        local_e0._16_8_ = 5;
        bVar4 = Pattern::createPatternVars
                          (&local_68,
                           (PatternSyntax *)
                           (syntax->prods).super_SyntaxListBase._vptr_SyntaxListBase[5],
                           (ExpressionSyntax *)syntax->randJoin,
                           (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)local_e0);
        uVar3 = local_e0._0_8_;
        if (!bVar4) {
          this->stmt = (Statement *)InvalidStatement::Instance;
        }
        if (local_e0._8_8_ != 0) {
          lVar7 = local_e0._8_8_ << 3;
          lVar8 = 0;
          do {
            (*p_Var9)(iVar6,*(Symbol **)
                             ((long)&(((optional<slang::ConstantRange> *)uVar3)->
                                     super__Optional_base<slang::ConstantRange,_true,_true>).
                                     _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                     _M_payload + lVar8));
            lVar8 = lVar8 + 8;
          } while (lVar7 != lVar8);
        }
      }
      else {
        if (SVar1 != ForeachLoopStatement) {
          return;
        }
        local_e0._0_8_ = local_e0 + 0x18;
        local_e0._8_8_ = 0;
        local_e0._16_8_ = 4;
        local_68.scope.ptr = &this->super_Scope;
        local_68.lookupIndex = 0xffffffff;
        local_68.flags.m_bits = 0;
        local_68.instanceOrProc = (Symbol *)0x0;
        local_68.firstTempVar = (TempVarSymbol *)0x0;
        local_68.randomizeDetails = (RandomizeDetails *)0x0;
        local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
        pEVar5 = ForeachLoopStatement::buildLoopDims
                           ((ForeachLoopListSyntax *)syntax[1].super_SyntaxNode.parent,&local_68,
                            (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)local_e0);
        uVar3 = local_e0._0_8_;
        if (pEVar5 == (Expression *)0x0) {
          this->stmt = (Statement *)InvalidStatement::Instance;
        }
        if (local_e0._8_8_ != 0) {
          lVar8 = local_e0._8_8_ * 0x18;
          lVar7 = 0;
          do {
            pSVar2 = *(Symbol **)((long)(uVar3 + 0x10) + lVar7);
            if (pSVar2 != (Symbol *)0x0) {
              (*p_Var9)(iVar6,pSVar2);
            }
            lVar7 = lVar7 + 0x18;
          } while (lVar8 != lVar7);
        }
      }
    }
    else if (SVar1 == PatternCaseItem) {
      local_68.scope.ptr = &this->super_Scope;
      local_68.lookupIndex = 0xffffffff;
      local_68.flags.m_bits = 0;
      local_68.instanceOrProc = (Symbol *)0x0;
      local_68.firstTempVar = (TempVarSymbol *)0x0;
      local_68.randomizeDetails = (RandomizeDetails *)0x0;
      local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
      local_e0._0_8_ = local_e0 + 0x18;
      local_e0._8_8_ = 0;
      local_e0._16_8_ = 5;
      bVar4 = Pattern::createPatternVars
                        (&local_68,(PatternSyntax *)syntax->randJoin,
                         (ExpressionSyntax *)(syntax->super_SyntaxNode).parent[5].previewNode,
                         (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)local_e0);
      uVar3 = local_e0._0_8_;
      if (!bVar4) {
        this->stmt = (Statement *)InvalidStatement::Instance;
      }
      if (local_e0._8_8_ != 0) {
        lVar7 = local_e0._8_8_ << 3;
        lVar8 = 0;
        do {
          (*p_Var9)(iVar6,*(Symbol **)
                           ((long)&(((optional<slang::ConstantRange> *)uVar3)->
                                   super__Optional_base<slang::ConstantRange,_true,_true>).
                                   _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                   _M_payload + lVar8));
          lVar8 = lVar8 + 8;
        } while (lVar7 != lVar8);
      }
    }
    else {
      if (SVar1 != RsRule) {
        return;
      }
      local_e0._0_8_ = local_e0 + 0x18;
      local_e0._8_8_ = 0;
      local_e0._16_8_ = 5;
      RandSeqProductionSymbol::createRuleVariables
                (syntax,&this->super_Scope,(SmallVectorBase<const_slang::ast::Symbol_*> *)local_e0);
      uVar3 = local_e0._0_8_;
      if (local_e0._8_8_ != 0) {
        lVar7 = local_e0._8_8_ << 3;
        lVar8 = 0;
        do {
          (*p_Var9)(iVar6,*(Symbol **)
                           ((long)&(((optional<slang::ConstantRange> *)uVar3)->
                                   super__Optional_base<slang::ConstantRange,_true,_true>).
                                   _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                   _M_payload + lVar8));
          lVar8 = lVar8 + 8;
        } while (lVar7 != lVar8);
      }
    }
    if ((pointer)local_e0._0_8_ != (pointer)(local_e0 + 0x18)) {
      operator_delete((void *)local_e0._0_8_);
    }
  }
  return;
}

Assistant:

void StatementBlockSymbol::elaborateVariables(function_ref<void(const Symbol&)> insertCB) const {
    SLANG_ASSERT(!stmt);

    auto syntax = getSyntax();
    if (!syntax)
        return;

    if (syntax->kind == SyntaxKind::RsRule) {
        // Create variables to hold results from all non-void productions
        // invoked by this rule.
        SmallVector<const Symbol*> vars;
        RandSeqProductionSymbol::createRuleVariables(syntax->as<RsRuleSyntax>(), *this, vars);
        for (auto var : vars)
            insertCB(*var);
    }
    else if (syntax->kind == SyntaxKind::ForeachLoopStatement) {
        SmallVector<ForeachLoopStatement::LoopDim, 4> dims;
        ASTContext context(*this, LookupLocation::max);

        if (!ForeachLoopStatement::buildLoopDims(*syntax->as<ForeachLoopStatementSyntax>().loopList,
                                                 context, dims)) {
            // If building loop dims failed we don't want to later proceed with trying to
            // bind the statement again, so just set to invalid here.
            stmt = &InvalidStatement::Instance;
        }

        for (auto& dim : dims) {
            if (dim.loopVar)
                insertCB(*dim.loopVar);
        }
    }
    else if (syntax->kind == SyntaxKind::ConditionalPattern) {
        ASTContext context(*this, LookupLocation::max);

        auto& cond = syntax->as<ConditionalPatternSyntax>();
        SLANG_ASSERT(cond.matchesClause);

        SmallVector<const PatternVarSymbol*> vars;
        if (!Pattern::createPatternVars(context, *cond.matchesClause->pattern, *cond.expr, vars))
            stmt = &InvalidStatement::Instance;

        for (auto var : vars)
            insertCB(*var);
    }
    else if (syntax->kind == SyntaxKind::PatternCaseItem) {
        ASTContext context(*this, LookupLocation::max);
        SLANG_ASSERT(syntax->parent);
        auto& caseSyntax = syntax->parent->as<CaseStatementSyntax>();

        SmallVector<const PatternVarSymbol*> vars;
        if (!Pattern::createPatternVars(context, *syntax->as<PatternCaseItemSyntax>().pattern,
                                        *caseSyntax.expr, vars)) {
            stmt = &InvalidStatement::Instance;
        }

        for (auto var : vars)
            insertCB(*var);
    }
}